

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::Trim(ON_PolyCurve *this,ON_Interval *domain)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  double *pdVar8;
  ON_Curve **ppOVar9;
  double dVar10;
  double dVar11;
  ON_Interval local_158;
  double local_148 [2];
  double local_130;
  ON_Curve *local_128;
  ON_Curve *curve_1;
  double local_108;
  ON_Curve *local_100;
  ON_Curve *curve;
  ON_Interval s_dom;
  ON_Interval c_dom;
  ON_Interval trim_c_dom;
  ON_Interval trim_s_dom;
  bool bTrimLastSegment;
  bool bTrimFirstSegment;
  double fuzz;
  undefined1 local_98 [8];
  ON_SimpleArray<double> tmp_t;
  ON_SimpleArray<ON_Curve_*> tmp_seg;
  int local_60;
  int i;
  int s1;
  int s0;
  ON_Interval actual_trim_domain;
  ON_Interval output_domain;
  ON_Interval original_polycurve_domain;
  int segment_count;
  ON_Interval *domain_local;
  ON_PolyCurve *this_local;
  
  iVar5 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  iVar6 = ON_SimpleArray<double>::Count(&this->m_t);
  if (((iVar6 < 2) || (iVar6 = ON_SimpleArray<double>::Count(&this->m_t), iVar5 + 1 != iVar6)) ||
     (bVar3 = ON_Interval::IsIncreasing(domain), !bVar3)) {
    this_local._7_1_ = false;
  }
  else {
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    bVar3 = ON_Interval::IsIncreasing((ON_Interval *)(output_domain.m_t + 1));
    if (bVar3) {
      actual_trim_domain.m_t[1] = domain->m_t[0];
      output_domain.m_t[0] = domain->m_t[1];
      bVar3 = ON_Interval::Intersection
                        ((ON_Interval *)(actual_trim_domain.m_t + 1),
                         (ON_Interval *)(output_domain.m_t + 1));
      if (bVar3) {
        bVar3 = ON_Interval::IsIncreasing((ON_Interval *)(actual_trim_domain.m_t + 1));
        if (bVar3) {
          bVar3 = ON_Interval::operator==
                            ((ON_Interval *)(actual_trim_domain.m_t + 1),
                             (ON_Interval *)(output_domain.m_t + 1));
          if (bVar3) {
            this_local._7_1_ = true;
          }
          else {
            _s1 = actual_trim_domain.m_t[1];
            actual_trim_domain.m_t[0] = output_domain.m_t[0];
            i = -2;
            local_60 = -3;
            pdVar8 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),0);
            bVar3 = ParameterSearch(this,*pdVar8,&i,true);
            if (((bVar3) && (-1 < i)) && (i <= iVar5)) {
              pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,i);
              dVar11 = *pdVar8;
              pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,0);
              *pdVar8 = dVar11;
            }
            pdVar8 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),1);
            bVar3 = ParameterSearch(this,*pdVar8,&local_60,true);
            if (((bVar3) && (-1 < local_60)) && (local_60 <= iVar5)) {
              pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,local_60);
              dVar11 = *pdVar8;
              pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,1);
              *pdVar8 = dVar11;
              local_60 = local_60 + -1;
            }
            bVar3 = ON_Interval::IsIncreasing((ON_Interval *)&s1);
            if (bVar3) {
              if (((i < 0) || (local_60 < i)) || (iVar5 <= local_60)) {
                this_local._7_1_ = false;
              }
              else {
                ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
                bVar3 = ON_Interval::operator==
                                  ((ON_Interval *)&s1,(ON_Interval *)(output_domain.m_t + 1));
                if (bVar3) {
                  pdVar8 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),0);
                  dVar11 = *pdVar8;
                  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                  *pdVar8 = dVar11;
                  pdVar8 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),1);
                  dVar11 = *pdVar8;
                  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,iVar5);
                  *pdVar8 = dVar11;
                  this_local._7_1_ = true;
                }
                else {
                  for (tmp_seg.m_capacity = 0; iVar6 = local_60, tmp_seg.m_capacity < i;
                      tmp_seg.m_capacity = tmp_seg.m_capacity + 1) {
                    ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                         tmp_seg.m_capacity);
                    if (*ppOVar9 != (ON_Curve *)0x0) {
                      (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                    }
                    ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                         tmp_seg.m_capacity);
                    *ppOVar9 = (ON_Curve *)0x0;
                  }
                  while (tmp_seg.m_capacity = iVar6 + 1, tmp_seg.m_capacity < iVar5) {
                    ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                         tmp_seg.m_capacity);
                    if (*ppOVar9 != (ON_Curve *)0x0) {
                      (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                    }
                    ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                         tmp_seg.m_capacity);
                    *ppOVar9 = (ON_Curve *)0x0;
                    iVar6 = tmp_seg.m_capacity;
                  }
                  ON_SimpleArray<ON_Curve_*>::SetCount
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_60 + 1);
                  ON_SimpleArray<double>::SetCount(&this->m_t,local_60 + 2);
                  if (0 < i) {
                    ON_SimpleArray<ON_Curve_*>::ON_SimpleArray
                              ((ON_SimpleArray<ON_Curve_*> *)&tmp_t.m_count,
                               (long)((local_60 - i) + 1));
                    ON_SimpleArray<double>::ON_SimpleArray
                              ((ON_SimpleArray<double> *)local_98,(long)((local_60 - i) + 2));
                    iVar5 = local_60 - i;
                    ppOVar9 = ON_SimpleArray<ON_Curve_*>::Array
                                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
                    ON_SimpleArray<ON_Curve_*>::Append
                              ((ON_SimpleArray<ON_Curve_*> *)&tmp_t.m_count,iVar5 + 1,ppOVar9 + i);
                    iVar5 = local_60 - i;
                    pdVar8 = ON_SimpleArray<double>::Array(&this->m_t);
                    ON_SimpleArray<double>::Append
                              ((ON_SimpleArray<double> *)local_98,iVar5 + 2,pdVar8 + i);
                    ON_SimpleArray<ON_Curve_*>::Zero
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
                    ON_SimpleArray<ON_Curve_*>::SetCount
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
                    iVar5 = ON_SimpleArray<ON_Curve_*>::Count
                                      ((ON_SimpleArray<ON_Curve_*> *)&tmp_t.m_count);
                    ppOVar9 = ON_SimpleArray<ON_Curve_*>::Array
                                        ((ON_SimpleArray<ON_Curve_*> *)&tmp_t.m_count);
                    ON_SimpleArray<ON_Curve_*>::Append
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,iVar5,ppOVar9);
                    ON_SimpleArray<double>::operator=(&this->m_t,(ON_SimpleArray<double> *)local_98)
                    ;
                    local_60 = local_60 - i;
                    i = 0;
                    ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)local_98);
                    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray
                              ((ON_SimpleArray<ON_Curve_*> *)&tmp_t.m_count);
                  }
                  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                  dVar11 = *pdVar8;
                  pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,0);
                  bVar3 = true;
                  if ((*pdVar8 <= dVar11) && (bVar3 = false, local_60 == 0)) {
                    pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,1);
                    dVar11 = *pdVar8;
                    pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,local_60 + 1);
                    bVar3 = dVar11 < *pdVar8;
                  }
                  bVar2 = false;
                  if (i < local_60) {
                    pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,1);
                    dVar11 = *pdVar8;
                    pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,local_60 + 1);
                    bVar2 = dVar11 < *pdVar8;
                  }
                  ON_Interval::ON_Interval((ON_Interval *)(trim_c_dom.m_t + 1));
                  ON_Interval::ON_Interval((ON_Interval *)(c_dom.m_t + 1));
                  ON_Interval::ON_Interval((ON_Interval *)(s_dom.m_t + 1));
                  ON_Interval::ON_Interval((ON_Interval *)&curve);
                  if (bVar3) {
                    local_100 = SegmentCurve(this,0);
                    if (local_100 == (ON_Curve *)0x0) {
                      return false;
                    }
                    (*(local_100->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
                    local_108 = dVar11;
                    c_dom.m_t[0] = dVar11;
                    bVar4 = ON_Interval::IsIncreasing((ON_Interval *)(s_dom.m_t + 1));
                    if (!bVar4) {
                      return false;
                    }
                    _curve_1 = SegmentDomain(this,0);
                    dVar11 = curve_1._8_8_;
                    curve = curve_1;
                    s_dom.m_t[0] = dVar11;
                    bVar4 = ON_Interval::IsIncreasing((ON_Interval *)&curve);
                    dVar10 = s_dom.m_t[0];
                    if (!bVar4) {
                      return false;
                    }
                    trim_c_dom.m_t[1] = (double)curve;
                    bVar4 = ON_Interval::Intersection
                                      ((ON_Interval *)(trim_c_dom.m_t + 1),(ON_Interval *)&s1);
                    if (!bVar4) {
                      return false;
                    }
                    if (0 < local_60) {
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(trim_c_dom.m_t + 1),1);
                      dVar1 = *pdVar8;
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)&curve,1);
                      if ((dVar1 != *pdVar8) || (NAN(dVar1) || NAN(*pdVar8))) {
                        return false;
                      }
                    }
                    bVar4 = ON_Interval::IsIncreasing((ON_Interval *)(trim_c_dom.m_t + 1));
                    if (!bVar4) {
                      return false;
                    }
                    bVar4 = ON_Interval::operator!=
                                      ((ON_Interval *)(s_dom.m_t + 1),(ON_Interval *)&curve);
                    if (bVar4) {
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(trim_c_dom.m_t + 1),0);
                      dVar10 = ON_Interval::TransformParameterTo
                                         ((ON_Interval *)&curve,(ON_Interval *)(s_dom.m_t + 1),
                                          *pdVar8);
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(c_dom.m_t + 1),0);
                      *pdVar8 = dVar10;
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(trim_c_dom.m_t + 1),1);
                      dVar10 = ON_Interval::TransformParameterTo
                                         ((ON_Interval *)&curve,(ON_Interval *)(s_dom.m_t + 1),
                                          *pdVar8);
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(c_dom.m_t + 1),1);
                      *pdVar8 = dVar10;
                      bVar4 = ON_Interval::IsIncreasing((ON_Interval *)(c_dom.m_t + 1));
                      if (!bVar4) {
                        pdVar8 = ON_Interval::operator[]((ON_Interval *)(trim_c_dom.m_t + 1),0);
                        dVar10 = ON_Interval::NormalizedParameterAt((ON_Interval *)&curve,*pdVar8);
                        dVar11 = 0.999;
                        if ((dVar10 < 0.999) || (local_60 < 1)) {
                          return false;
                        }
                        bVar3 = false;
                        local_100 = (ON_Curve *)0x0;
                        ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
                        if (*ppOVar9 != (ON_Curve *)0x0) {
                          (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                        }
                        ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
                        *ppOVar9 = (ON_Curve *)0x0;
                        ON_SimpleArray<double>::Remove(&this->m_t,0);
                        ON_SimpleArray<ON_Curve_*>::Remove
                                  (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
                        local_60 = local_60 + -1;
                      }
                    }
                    else {
                      c_dom.m_t[1] = trim_c_dom.m_t[1];
                      trim_c_dom.m_t[0] = dVar10;
                    }
                    if ((bVar3) &&
                       (bVar3 = ON_Interval::operator!=
                                          ((ON_Interval *)(c_dom.m_t + 1),
                                           (ON_Interval *)(s_dom.m_t + 1)), bVar3)) {
                      uVar7 = (*(local_100->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c]
                              )();
                      if ((uVar7 & 1) == 0) {
                        pdVar8 = ON_Interval::operator[]((ON_Interval *)(c_dom.m_t + 1),0);
                        dVar10 = ON_Interval::NormalizedParameterAt
                                           ((ON_Interval *)(s_dom.m_t + 1),*pdVar8);
                        dVar11 = 0.999;
                        if ((dVar10 < 0.999) || (local_60 < 1)) {
                          return false;
                        }
                        local_100 = (ON_Curve *)0x0;
                        ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
                        if (*ppOVar9 != (ON_Curve *)0x0) {
                          (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                        }
                        ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
                        *ppOVar9 = (ON_Curve *)0x0;
                        ON_SimpleArray<double>::Remove(&this->m_t,0);
                        ON_SimpleArray<ON_Curve_*>::Remove
                                  (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
                        local_60 = local_60 + -1;
                      }
                      else {
                        pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,0);
                        dVar10 = *pdVar8;
                        pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                        *pdVar8 = dVar10;
                        if (((local_60 == 0) &&
                            (iVar5 = ON_SimpleArray<double>::Count(&this->m_t), iVar5 == 2)) &&
                           (!bVar2)) {
                          pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,1);
                          dVar10 = *pdVar8;
                          pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,1);
                          *pdVar8 = dVar10;
                        }
                      }
                    }
                  }
                  if (bVar2) {
                    iVar5 = local_60 + 1;
                    iVar6 = ON_SimpleArray<ON_Curve_*>::Count
                                      (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
                    if (iVar5 != iVar6) {
                      return false;
                    }
                    local_128 = SegmentCurve(this,local_60);
                    if (local_128 == (ON_Curve *)0x0) {
                      return false;
                    }
                    (*(local_128->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
                    local_130 = dVar11;
                    c_dom.m_t[0] = dVar11;
                    bVar3 = ON_Interval::IsIncreasing((ON_Interval *)(s_dom.m_t + 1));
                    if (!bVar3) {
                      return false;
                    }
                    local_148 = (double  [2])SegmentDomain(this,local_60);
                    curve = (ON_Curve *)local_148[0];
                    s_dom.m_t[0] = local_148[1];
                    bVar3 = ON_Interval::IsIncreasing((ON_Interval *)&curve);
                    if (!bVar3) {
                      return false;
                    }
                    pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,local_60);
                    dVar11 = *pdVar8;
                    pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,1);
                    ON_Interval::ON_Interval(&local_158,dVar11,*pdVar8);
                    trim_c_dom.m_t[1] = local_158.m_t[0];
                    bVar3 = ON_Interval::IsIncreasing((ON_Interval *)(trim_c_dom.m_t + 1));
                    if (!bVar3) {
                      return false;
                    }
                    pdVar8 = ON_Interval::operator[]((ON_Interval *)(s_dom.m_t + 1),0);
                    dVar11 = *pdVar8;
                    pdVar8 = ON_Interval::operator[]((ON_Interval *)(c_dom.m_t + 1),0);
                    *pdVar8 = dVar11;
                    bVar3 = ON_Interval::operator!=
                                      ((ON_Interval *)(s_dom.m_t + 1),(ON_Interval *)&curve);
                    if (bVar3) {
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(trim_c_dom.m_t + 1),1);
                      dVar11 = ON_Interval::TransformParameterTo
                                         ((ON_Interval *)&curve,(ON_Interval *)(s_dom.m_t + 1),
                                          *pdVar8);
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(c_dom.m_t + 1),1);
                      *pdVar8 = dVar11;
                      bVar3 = ON_Interval::IsIncreasing((ON_Interval *)(c_dom.m_t + 1));
                      if (!bVar3) {
                        pdVar8 = ON_Interval::operator[]((ON_Interval *)(trim_c_dom.m_t + 1),1);
                        dVar11 = ON_Interval::NormalizedParameterAt((ON_Interval *)&curve,*pdVar8);
                        if ((0.001 < dVar11) || (local_60 < 1)) {
                          return false;
                        }
                        bVar2 = false;
                        local_128 = (ON_Curve *)0x0;
                        ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                             local_60);
                        if (*ppOVar9 != (ON_Curve *)0x0) {
                          (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                        }
                        ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                             local_60);
                        *ppOVar9 = (ON_Curve *)0x0;
                        ON_SimpleArray<double>::Remove(&this->m_t);
                        ON_SimpleArray<ON_Curve_*>::Remove
                                  (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
                        local_60 = local_60 + -1;
                      }
                    }
                    else {
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(trim_c_dom.m_t + 1),1);
                      dVar11 = *pdVar8;
                      pdVar8 = ON_Interval::operator[]((ON_Interval *)(c_dom.m_t + 1),1);
                      *pdVar8 = dVar11;
                    }
                    if ((bVar2) &&
                       (bVar3 = ON_Interval::operator!=
                                          ((ON_Interval *)(s_dom.m_t + 1),
                                           (ON_Interval *)(c_dom.m_t + 1)), bVar3)) {
                      uVar7 = (*(local_128->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c]
                              )(local_128,c_dom.m_t + 1);
                      if ((uVar7 & 1) == 0) {
                        pdVar8 = ON_Interval::operator[]((ON_Interval *)(c_dom.m_t + 1),1);
                        dVar11 = ON_Interval::NormalizedParameterAt
                                           ((ON_Interval *)(s_dom.m_t + 1),*pdVar8);
                        if ((0.001 < dVar11) || (local_60 < 1)) {
                          return false;
                        }
                        local_128 = (ON_Curve *)0x0;
                        ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                             local_60);
                        if (*ppOVar9 != (ON_Curve *)0x0) {
                          (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                        }
                        ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                             local_60);
                        *ppOVar9 = (ON_Curve *)0x0;
                        ON_SimpleArray<double>::Remove(&this->m_t);
                        ON_SimpleArray<ON_Curve_*>::Remove
                                  (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
                        local_60 = local_60 + -1;
                      }
                      else {
                        pdVar8 = ON_Interval::operator[]((ON_Interval *)&s1,1);
                        dVar11 = *pdVar8;
                        iVar5 = ON_SimpleArray<double>::Count(&this->m_t);
                        pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,iVar5 + -1);
                        *pdVar8 = dVar11;
                      }
                    }
                  }
                  pdVar8 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),0);
                  dVar11 = *pdVar8;
                  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                  *pdVar8 = dVar11;
                  pdVar8 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),1);
                  dVar11 = *pdVar8;
                  iVar5 = ON_SimpleArray<double>::Count(&this->m_t);
                  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,iVar5 + -1);
                  *pdVar8 = dVar11;
                  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
                  this_local._7_1_ = true;
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyCurve::Trim(
  const ON_Interval& domain
  )
{
  // Please talk to Dale Lear before you change code in this function.

  // m_t[] = Increasing array of segment_count+1 parameter values
  //         that specify segment domains.  
  //         Domain of polycurve = (m_t[0],m_t[segment_count]).
  // m_segment[] = array of segment curves
  int segment_count = m_segment.Count();
  if ( m_t.Count() < 2 || segment_count+1 != m_t.Count() || !domain.IsIncreasing() )
  {
    // bogus input
    return false;
  }

  const ON_Interval original_polycurve_domain = Domain();
  if ( !original_polycurve_domain.IsIncreasing() )
    return false;

  ON_Interval output_domain = domain;
  if ( !output_domain.Intersection(original_polycurve_domain) )
    return false;

	if(!output_domain.IsIncreasing())
		return false;

  if (output_domain == original_polycurve_domain )
    return true;

  ON_Interval actual_trim_domain = output_domain;

  int s0 = -2; // s0 gets set to index of first segment we keep
  int s1 = -3; // s1 gets set to index of last segment we keep
  
  // 22 October 2003 Dale Lear - redid Greg's parameter search 
  //   snapping stuff.  New stuff is in sourcesafe version 72.
  //   In particular, attempting using "Trim" to extend polycurves
  //   will not be supported.  You have to use "Extend" if you
  //   want a curve to get longer.

  // In mid 3003, Greg added ParameterSearch to do "microtol" snapping 
  // to segment end parameters.  The goal was to handle fuzz that gets
  // introduces by reparameterizations that happen when the top level
  // curve is a proxy/poly curve and the proxy/polycurve trim parameters get
  // readjusted as we move toward trimming the "real" curve that is 
  // stored in the m_segment[] array.
	if ( ParameterSearch(output_domain[0], s0, true ) )
  {
    // ParameterSearch says domain[0] is within "microtol" of
    // m_t[s0].  So we will actually trim at m_t[s0].
    if (s0 >= 0 && s0 <= segment_count)
    {
      actual_trim_domain[0]=m_t[s0];
    }
  }

	if ( ParameterSearch(output_domain[1], s1, true ) )
  {
    if (s1 >= 0 && s1 <= segment_count )
    {
      // ParameterSearch says domain[1] is within "microtol" of
      // m_t[s1].  So we will actually trim at m_t[s1].
      actual_trim_domain[1]=m_t[s1];
      s1--;
    }
  }

  if ( !actual_trim_domain.IsIncreasing() )
  {
    // After microtol snapping, there is not enough curve left to trim.
    return false;
  }

  if ( s0 < 0 || s0 > s1 || s1 >= segment_count )
  {
    // Because output_domain is a subinterval of original_polycurve_domain,
    // the only way that (s0 < 0 || s0 > s1 || s1 >= segment_count) can be true
    // is if something is seriously wrong with the m_t[] values.
    return false;
  }

  // we will begin modifying the polycurve
  DestroyCurveTree();

  if ( actual_trim_domain == original_polycurve_domain )
  {
    // ParameterSearch says that the ends of output_domain
    // were microtol away from being the entire curve.  
    // Set the domain and return.
    m_t[0] = output_domain[0];
    m_t[segment_count] = output_domain[1];
    return true;
  }
	
  int i;
  for ( i = 0; i < s0; i++ )
  {
    // delete curves in segments [0,...,s0-1]
    delete m_segment[i];
    m_segment[i] = 0;
  }
  for ( i = s1+1; i < segment_count; i++ )
  {
    // delete curves in segments [s1+1,...,segment_count-1]
    delete m_segment[i];
    m_segment[i] = 0;
  }

  // remove segments [s1+1,...,segment_count-1] from polycurve
  m_segment.SetCount( s1+1 );
  m_t.SetCount(s1+2);
  segment_count = s1+1;

  if ( s0 > 0 )
  {
    // remove segments [0,...,s0-1] from polycurve
    ON_SimpleArray<ON_Curve*> tmp_seg(s1+1-s0);
    ON_SimpleArray<double> tmp_t(s1+2-s0);
    tmp_seg.Append( s1+1-s0, m_segment.Array()+s0 );
    tmp_t.Append( s1+2-s0, m_t.Array()+s0 );
    m_segment.Zero();
    m_segment.SetCount( 0 );
    m_segment.Append( tmp_seg.Count(), tmp_seg.Array() );
    m_t = tmp_t;
    segment_count = s1-s0+1;
    s1 = segment_count-1;
    s0 = 0;
  }


  const double fuzz = 0.001; // Greg says: anything small and > 1.0e-6 will work about the same
  bool bTrimFirstSegment = ( m_t[0] < actual_trim_domain[0] || (0 == s1 && actual_trim_domain[1] < m_t[s1+1]) );
  bool bTrimLastSegment = (s1>s0 && actual_trim_domain[1] < m_t[s1+1]);

  // if needed, trim left end of first segment
  ON_Interval trim_s_dom, trim_c_dom, c_dom, s_dom;

  if ( bTrimFirstSegment )
  {
    ON_Curve* curve = SegmentCurve(0);
    if ( 0 == curve )
      return false; // bogus polycurve (m_segment[0] is a nullptr pointer)

    c_dom = curve->Domain();
    if ( !c_dom.IsIncreasing() )
    {
      // first segment curve is bogus
      return false;
    }

    s_dom = SegmentDomain(0);
    if ( !s_dom.IsIncreasing() )
    {
      // m_t[0] or m_t[1] is bogus
      return false;
    }

    trim_s_dom = s_dom;
	  if ( !trim_s_dom.Intersection(actual_trim_domain) )
    {
      // Should never happen; if it does, we have to give up.
      // (and there is probably a bug in the code above)
      return false;
    }

    if ( s1 > 0 && trim_s_dom[1] != s_dom[1] )
    {
      // Should never happen; if it does, we have to give up.
      // (and there is probably a bug in the code above)
      return false;
    }

    if ( !trim_s_dom.IsIncreasing() )
    {
      // Should never happen; if it does, we have to give up.
      // (and there is probably a bug in the code above)
      return false;
    }

    if ( c_dom != s_dom )
    {
      // need to convert polycurve parameters to "real" segment curve parameters
      trim_c_dom[0] = s_dom.TransformParameterTo(c_dom, trim_s_dom[0]);
      trim_c_dom[1] = s_dom.TransformParameterTo(c_dom, trim_s_dom[1]);
      if ( !trim_c_dom.IsIncreasing() )
      {
        if ( s_dom.NormalizedParameterAt(trim_s_dom[0]) >= 1.0-fuzz && s1 > 0 )
        {
          // We were trying to throw away all but a microscopic bit on the right
          // end of the first segment of a multi segment polycurve
          // and the parameter conversion killed the "real" trim interval.
          // In this case, we can just throw away the first segment.
          bTrimFirstSegment = false;
          curve = 0;
          delete m_segment[0];
          m_segment[0] = 0;
			    m_t.Remove(0);
			    m_segment.Remove(0);
			    s1--; // removing a segment, means s1=(index of last valid segment) has to get decremented.
        }
        else
          return false;
      }
    }
    else
    {
      trim_c_dom = trim_s_dom;
    }

    // trim_s_dom = polycurve segment parameters after trimming
    // trim_c_dom = "real" segment curve parameters after trimming

    if ( bTrimFirstSegment && trim_c_dom != c_dom )
    {
      // trim first segment
      if ( !curve->Trim(trim_c_dom) )
      {
        // trimming first segment failed - see if we should give up or
        // or just discard the first segment.

			  if ( c_dom.NormalizedParameterAt(trim_c_dom[0]) >= 1.0 - fuzz && s1 > 0 )
        {
			    // remove entire first segment
          bTrimFirstSegment = false;
          curve = 0;
          delete m_segment[0];
          m_segment[0] = 0;
			    m_t.Remove(0);
			    m_segment.Remove(0);
			    s1--; // removing a segment, means s1=(index of last valid segment) has to get decremented.
        }
        else
          return false;
		  }
      else
      {
        m_t[0] = actual_trim_domain[0]; // will be tweaked below when we've finished.
        if ( 0 == s1 && 2 == m_t.Count() && !bTrimLastSegment )
          m_t[1] = actual_trim_domain[1];
      }
    }
  }



  if ( bTrimLastSegment ) 
  {
    // If we get in here, it means we need to trim a portion off of
    // the right end of the last segment.
    
    if ( s1+1 != m_segment.Count() )
    {
      // Should never happen; if it does, we have to give up.
      // (and there is probably a bug in the code above)
      return false;
    }

    ON_Curve* curve = SegmentCurve(s1);
    if ( 0 == curve )
      return false; // bogus polycurve (m_segment[s1] array has a null pointer)

    c_dom = curve->Domain();
    if ( !c_dom.IsIncreasing() )
    {
      // first segment curve is bogus
      return false;
    }

    s_dom = SegmentDomain(s1);
    if ( !s_dom.IsIncreasing() )
    {
      // m_t[s1] or m_t[s1+1] is bogus
      return false;
    }

		// trim the curve on the right
    trim_s_dom= ON_Interval(m_t[s1], actual_trim_domain[1]);

    if ( !trim_s_dom.IsIncreasing() )
    {
      // Should never happen; if it does, we have to give up.
      // (and there is probably a bug in the code above)
      return false;
    }

    trim_c_dom[0] = c_dom[0];
    if ( c_dom != s_dom )
    {
      trim_c_dom[1] = s_dom.TransformParameterTo(c_dom, trim_s_dom[1]);
      if ( !trim_c_dom.IsIncreasing() )
      {
        if ( s_dom.NormalizedParameterAt(trim_s_dom[1]) <= fuzz && s1 > 0 )
        {
          // We were trying to throw away all but a microscopic bit on the left
          // end of the last segment of a multi segment polycurve
          // and the parameter conversion killed the "real" trim interval.
          // In this case, we can just throw away the last segment.
          bTrimLastSegment = false;
          curve = 0;
          delete m_segment[s1];
          m_segment[s1] = 0;
			    m_t.Remove();       // remove last array entry in the m_t[] array
			    m_segment.Remove(); // remove last array entry in the m_segment[] array
			    s1--; // removing a segment, means s1=(index of last valid segment) has to get decremented.
        }
        else
          return false;
      }
    }
    else
    {
      trim_c_dom[1] = trim_s_dom[1];
    }

    if ( bTrimLastSegment && c_dom != trim_c_dom )
    {
      // trim last segment
      if ( !curve->Trim(trim_c_dom) )
      {

				if ( c_dom.NormalizedParameterAt(trim_c_dom[1]) <= fuzz && s1 > 0)
        {
          // We were trying to throw away all but a microscopic bit on the left
          // end of the last segment of a multi segment polycurve
          // and the segment curve's trimmer failed.  I'm assuming the
          // failure was caused because the part that would be left was
          // too short.
          // In this case, we can just throw away the last segment.
          bTrimLastSegment = false;
          curve = 0;
          delete m_segment[s1];
          m_segment[s1] = 0;
			    m_t.Remove();       // remove last array entry in the m_t[] array
			    m_segment.Remove(); // remove last array entry in the m_segment[] array
			    s1--; // removing a segment, means s1=(index of last valid segment) has to get decremented.
        }
        else
          return false;
			}
      else
        m_t[m_t.Count()-1] = actual_trim_domain[1]; // will be tweaked below when we've finished.
		}
  }

  // If we get this far, trims were is successful.
  // The following makes potential tiny adjustments
  // that need to happen when trims get snapped to
  // m_t[] values that are within fuzz of the
  // output_domain[] values.
	m_t[0] = output_domain[0];
  m_t[m_t.Count()-1] = output_domain[1];

	DestroyCurveTree();

  return true;
}